

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O2

int __thiscall vkt::Draw::DrawIndexedTests::init(DrawIndexedTests *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  TestContext *pTVar2;
  int extraout_EAX;
  mapped_type *ppcVar3;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *pIVar4;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *pIVar5;
  TestSpec testSpec;
  allocator<char> local_18a;
  allocator<char> local_189;
  string local_188;
  string local_168;
  TestSpecBase local_148;
  TestSpecBase local_110;
  TestSpecBase local_d8;
  TestSpecBase local_a0;
  TestSpecBase local_68;
  
  p_Var1 = &local_148.shaders._M_t._M_impl.super__Rb_tree_header;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_dataplus._M_p._0_4_ = 0;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&local_148.shaders,(key_type *)&local_188);
  *ppcVar3 = "vulkan/draw/VertexFetch.vert";
  local_188._M_dataplus._M_p._0_4_ = 1;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&local_148.shaders,(key_type *)&local_188);
  *ppcVar3 = "vulkan/draw/VertexFetch.frag";
  local_148.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"draw_indexed_triangle_list",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Draws indexed triangle list",&local_18a);
  TestSpecBase::TestSpecBase(&local_68,&local_148);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar4,pTVar2,&local_188,&local_168,&local_68);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_68);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  local_148.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"draw_indexed_triangle_strip",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Draws indexed triangle strip",&local_18a);
  TestSpecBase::TestSpecBase(&local_a0,&local_148);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar4,pTVar2,&local_188,&local_168,&local_a0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_a0);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_148);
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_dataplus._M_p._0_4_ = 0;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_148.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&local_148.shaders,(key_type *)&local_188);
  *ppcVar3 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
  local_188._M_dataplus._M_p._0_4_ = 1;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&local_148.shaders,(key_type *)&local_188);
  *ppcVar3 = "vulkan/draw/VertexFetch.frag";
  local_148.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  pIVar5 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"draw_instanced_indexed_triangle_list",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Draws indexed triangle list",&local_18a);
  TestSpecBase::TestSpecBase(&local_d8,&local_148);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar5,pTVar2,&local_188,&local_168,&local_d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar5);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_d8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  local_148.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pIVar5 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"draw_instanced_indexed_triangle_strip",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Draws indexed triangle strip",&local_18a);
  TestSpecBase::TestSpecBase(&local_110,&local_148);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar5,pTVar2,&local_188,&local_168,&local_110);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar5);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_110);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_148);
  return extraout_EAX;
}

Assistant:

void DrawIndexedTests::init (void)
{
	{
		DrawIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
	{
		DrawInstancedIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
}